

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O0

void __thiscall
FNodeBuilder::PushConnectingGLSeg
          (FNodeBuilder *this,int subsector,
          TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,vertex_t *v1,vertex_t *v2)

{
  undefined1 local_80 [8];
  glseg_t newseg;
  vertex_t *v2_local;
  vertex_t *v1_local;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs_local;
  int subsector_local;
  FNodeBuilder *this_local;
  
  newseg.super_seg_t.frontsector = (sector_t *)0x0;
  newseg.super_seg_t.linedef = (line_t *)0x0;
  newseg.super_seg_t.sidedef = (side_t *)0x0;
  newseg.super_seg_t.v2 = (vertex_t *)0x0;
  newseg.super_seg_t.sidefrac = -NAN;
  local_80 = (undefined1  [8])v1;
  newseg.super_seg_t.v1 = v2;
  newseg._72_8_ = v2;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Push(segs,(glseg_t *)local_80);
  return;
}

Assistant:

void FNodeBuilder::PushConnectingGLSeg (int subsector, TArray<glseg_t> &segs, vertex_t *v1, vertex_t *v2)
{
	glseg_t newseg;

	newseg.v1 = v1;
	newseg.v2 = v2;
	newseg.backsector = NULL;
	newseg.frontsector = NULL;
	newseg.linedef = NULL;
	newseg.sidedef = NULL;
	newseg.Partner = DWORD_MAX;
	segs.Push (newseg);
}